

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_writer_init_filename(mpack_writer_t *writer,char *filename)

{
  FILE *file_00;
  FILE *file;
  char *filename_local;
  mpack_writer_t *writer_local;
  
  file_00 = fopen(filename,"wb");
  if (file_00 == (FILE *)0x0) {
    mpack_writer_init_error(writer,mpack_error_io);
  }
  else {
    mpack_writer_init_stdfile(writer,(FILE *)file_00,true);
  }
  return;
}

Assistant:

void mpack_writer_init_filename(mpack_writer_t* writer, const char* filename) {
    mpack_assert(filename != NULL, "filename is NULL");

    FILE* file = fopen(filename, "wb");
    if (file == NULL) {
        mpack_writer_init_error(writer, mpack_error_io);
        return;
    }

    mpack_writer_init_stdfile(writer, file, true);
}